

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen12CachePolicy::BestMatchingPATIdx
          (GmmGen12CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  uint uVar1;
  Context *pCVar2;
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  undefined1 auVar3 [32];
  GMM_GFX_MEMORY_TYPE GVar4;
  GMM_PRIVATE_PAT *pGVar5;
  GMM_PRIVATE_PAT *pGVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t PATIdx;
  undefined8 in_stack_ffffffffffffffc0;
  
  pCVar2 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext;
  auVar3 = CachePolicy._8_32_;
  CachePolicy_00._32_8_ = in_stack_ffffffffffffffc0;
  CachePolicy_00.IDCode = auVar3._0_4_;
  CachePolicy_00._4_4_ = auVar3._4_4_;
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)auVar3._8_8_;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)auVar3._16_4_;
  CachePolicy_00.field_3 = (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)auVar3._20_4_
  ;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)auVar3._24_8_;
  GVar4 = GmmCachePolicyCommon::GetWantedMemoryType((GmmCachePolicyCommon *)this,CachePolicy_00);
  PATIdx = 0;
  if (((pCVar2->WaTable).field_0x7 & 0x80) != 0) {
    GVar4 = GMM_GFX_UC_WITH_FENCE;
  }
  uVar8 = 1;
  while( true ) {
    uVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
            super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters;
    pGVar5 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,PATIdx);
    if (uVar1 <= uVar8) break;
    pGVar6 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,uVar8);
    uVar7 = uVar8;
    if (((ulong)pGVar6 & 3) != 0) {
      uVar7 = PATIdx;
    }
    if (((GMM_GFX_MEMORY_TYPE)pGVar6 & GMM_GFX_WB) == GVar4) {
      uVar7 = uVar8;
    }
    if (((GMM_GFX_MEMORY_TYPE)pGVar5 & GMM_GFX_WB) != GVar4) {
      PATIdx = uVar7;
    }
    uVar8 = uVar8 + 1;
  }
  uVar8 = 0xffffffff;
  if (((GMM_GFX_MEMORY_TYPE)pGVar5 & GMM_GFX_WB) == GVar4) {
    uVar8 = PATIdx;
  }
  return uVar8;
}

Assistant:

uint32_t GmmLib::GmmGen12CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t            i;
    uint32_t            PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    WA_TABLE *          pWaTable         = &const_cast<WA_TABLE &>(pGmmLibContext->GetWaTable());

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    // Override wantedMemoryType so that PAT.MT is UC
    // Gen12 uses max function to resolve PAT-vs-MOCS MemType, So unless PTE.PAT says UC, MOCS won't be able to set UC!
    if(pWaTable->WaMemTypeIsMaxOfPatAndMocs)
    {
        WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType,
                           (GMM_GFX_MEMORY_TYPE)PAT1.Gen12.MemoryType,
                           (GMM_GFX_MEMORY_TYPE)PAT2.Gen12.MemoryType))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).Gen12.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}